

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O1

void idct16_sse2(__m128i *input,__m128i *output)

{
  __m128i alVar1;
  __m128i alVar2;
  __m128i _in1;
  undefined1 auVar3 [16];
  __m128i alVar4;
  __m128i _in1_2;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  __m128i _in0_1;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar56 [16];
  __m128i _in0_2;
  undefined1 auVar57 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar70 [16];
  __m128i _in1_4;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  __m128i _in0;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  __m128i _in0_3;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  __m128i _in0_4;
  undefined1 auVar113 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar130 [16];
  __m128i _in1_1;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  __m128i _in1_3;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined2 local_88;
  undefined2 uStack_86;
  undefined2 uStack_84;
  undefined2 uStack_82;
  undefined2 uStack_80;
  undefined2 uStack_7e;
  undefined2 uStack_7c;
  undefined2 uStack_7a;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar43 [16];
  undefined1 auVar48 [16];
  undefined1 auVar53 [16];
  undefined1 auVar44 [16];
  undefined1 auVar49 [16];
  undefined1 auVar54 [16];
  undefined1 auVar45 [16];
  undefined1 auVar50 [16];
  undefined1 auVar55 [16];
  undefined1 auVar58 [16];
  undefined1 auVar67 [16];
  undefined1 auVar59 [16];
  undefined1 auVar68 [16];
  undefined1 auVar60 [16];
  undefined1 auVar69 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar114 [16];
  undefined1 auVar121 [16];
  undefined1 auVar127 [16];
  undefined1 auVar115 [16];
  undefined1 auVar122 [16];
  undefined1 auVar128 [16];
  undefined1 auVar116 [16];
  undefined1 auVar123 [16];
  undefined1 auVar129 [16];
  
  alVar4 = input[10];
  alVar1 = input[9];
  alVar2 = input[1];
  auVar60._0_12_ = alVar2._0_12_;
  auVar60._12_2_ = alVar2[0]._6_2_;
  auVar60._14_2_ = *(undefined2 *)((long)input[0xf] + 6);
  auVar59._12_4_ = auVar60._12_4_;
  auVar59._0_10_ = alVar2._0_10_;
  auVar59._10_2_ = *(undefined2 *)((long)input[0xf] + 4);
  auVar58._10_6_ = auVar59._10_6_;
  auVar58._0_8_ = alVar2[0];
  auVar58._8_2_ = alVar2[0]._4_2_;
  auVar57._8_8_ = auVar58._8_8_;
  auVar57._6_2_ = *(undefined2 *)((long)input[0xf] + 2);
  auVar57._4_2_ = alVar2[0]._2_2_;
  auVar57._0_2_ = (undefined2)alVar2[0];
  auVar57._2_2_ = (short)input[0xf][0];
  auVar5._2_2_ = (short)input[0xf][1];
  auVar5._0_2_ = (short)alVar2[1];
  auVar5._4_2_ = alVar2[1]._2_2_;
  auVar5._6_2_ = *(undefined2 *)((long)input[0xf] + 10);
  auVar5._8_2_ = alVar2[1]._4_2_;
  auVar5._10_2_ = *(undefined2 *)((long)input[0xf] + 0xc);
  auVar5._12_2_ = alVar2[1]._6_2_;
  auVar5._14_2_ = *(undefined2 *)((long)input[0xf] + 0xe);
  auVar3._8_4_ = 0xf0140191;
  auVar3._0_8_ = 0xf0140191f0140191;
  auVar3._12_4_ = 0xf0140191;
  auVar82 = pmaddwd(auVar57,auVar3);
  auVar3 = pmaddwd(auVar3,auVar5);
  auVar132._8_4_ = 0x1910fec;
  auVar132._0_8_ = 0x1910fec01910fec;
  auVar132._12_4_ = 0x1910fec;
  auVar61 = pmaddwd(auVar57,auVar132);
  auVar6 = pmaddwd(auVar5,auVar132);
  auVar83._0_4_ = auVar82._0_4_ + 0x800 >> 0xc;
  auVar83._4_4_ = auVar82._4_4_ + 0x800 >> 0xc;
  auVar83._8_4_ = auVar82._8_4_ + 0x800 >> 0xc;
  auVar83._12_4_ = auVar82._12_4_ + 0x800 >> 0xc;
  auVar82._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar82._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar82._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar82._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar84 = packssdw(auVar83,auVar82);
  auVar62._0_4_ = auVar61._0_4_ + 0x800 >> 0xc;
  auVar62._4_4_ = auVar61._4_4_ + 0x800 >> 0xc;
  auVar62._8_4_ = auVar61._8_4_ + 0x800 >> 0xc;
  auVar62._12_4_ = auVar61._12_4_ + 0x800 >> 0xc;
  auVar7._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar7._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar7._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar7._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar63 = packssdw(auVar62,auVar7);
  auVar98._0_12_ = alVar1._0_12_;
  auVar98._12_2_ = alVar1[0]._6_2_;
  auVar98._14_2_ = *(undefined2 *)((long)input[7] + 6);
  auVar97._12_4_ = auVar98._12_4_;
  auVar97._0_10_ = alVar1._0_10_;
  auVar97._10_2_ = *(undefined2 *)((long)input[7] + 4);
  auVar96._10_6_ = auVar97._10_6_;
  auVar96._0_8_ = alVar1[0];
  auVar96._8_2_ = alVar1[0]._4_2_;
  auVar95._8_8_ = auVar96._8_8_;
  auVar95._6_2_ = *(undefined2 *)((long)input[7] + 2);
  auVar95._4_2_ = alVar1[0]._2_2_;
  auVar95._0_2_ = (undefined2)alVar1[0];
  auVar95._2_2_ = (short)input[7][0];
  auVar23._2_2_ = (short)input[7][1];
  auVar23._0_2_ = (short)alVar1[1];
  auVar23._4_2_ = alVar1[1]._2_2_;
  auVar23._6_2_ = *(undefined2 *)((long)input[7] + 10);
  auVar23._8_2_ = alVar1[1]._4_2_;
  auVar23._10_2_ = *(undefined2 *)((long)input[7] + 0xc);
  auVar23._12_2_ = alVar1[1]._6_2_;
  auVar23._14_2_ = *(undefined2 *)((long)input[7] + 0xe);
  auVar80._8_4_ = 0xf5da0c5e;
  auVar80._0_8_ = 0xf5da0c5ef5da0c5e;
  auVar80._12_4_ = 0xf5da0c5e;
  auVar3 = pmaddwd(auVar95,auVar80);
  auVar82 = pmaddwd(auVar80,auVar23);
  auVar8._8_4_ = 0xc5e0a26;
  auVar8._0_8_ = 0xc5e0a260c5e0a26;
  auVar8._12_4_ = 0xc5e0a26;
  auVar99 = pmaddwd(auVar95,auVar8);
  auVar61 = pmaddwd(auVar23,auVar8);
  alVar1 = input[5];
  auVar6._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar6._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar6._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar6._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar85._0_4_ = auVar82._0_4_ + 0x800 >> 0xc;
  auVar85._4_4_ = auVar82._4_4_ + 0x800 >> 0xc;
  auVar85._8_4_ = auVar82._8_4_ + 0x800 >> 0xc;
  auVar85._12_4_ = auVar82._12_4_ + 0x800 >> 0xc;
  auVar3 = packssdw(auVar6,auVar85);
  auVar100._0_4_ = auVar99._0_4_ + 0x800 >> 0xc;
  auVar100._4_4_ = auVar99._4_4_ + 0x800 >> 0xc;
  auVar100._8_4_ = auVar99._8_4_ + 0x800 >> 0xc;
  auVar100._12_4_ = auVar99._12_4_ + 0x800 >> 0xc;
  auVar24._0_4_ = auVar61._0_4_ + 0x800 >> 0xc;
  auVar24._4_4_ = auVar61._4_4_ + 0x800 >> 0xc;
  auVar24._8_4_ = auVar61._8_4_ + 0x800 >> 0xc;
  auVar24._12_4_ = auVar61._12_4_ + 0x800 >> 0xc;
  auVar101 = packssdw(auVar100,auVar24);
  auVar105._0_12_ = alVar1._0_12_;
  auVar105._12_2_ = alVar1[0]._6_2_;
  auVar105._14_2_ = *(undefined2 *)((long)input[0xb] + 6);
  auVar107._12_4_ = auVar105._12_4_;
  auVar107._0_10_ = alVar1._0_10_;
  auVar107._10_2_ = *(undefined2 *)((long)input[0xb] + 4);
  auVar136._10_6_ = auVar107._10_6_;
  auVar136._0_8_ = alVar1[0];
  auVar136._8_2_ = alVar1[0]._4_2_;
  auVar92._8_8_ = auVar136._8_8_;
  auVar92._6_2_ = *(undefined2 *)((long)input[0xb] + 2);
  auVar92._4_2_ = alVar1[0]._2_2_;
  auVar92._0_2_ = (undefined2)alVar1[0];
  auVar92._2_2_ = (short)input[0xb][0];
  auVar40._2_2_ = (short)input[0xb][1];
  auVar40._0_2_ = (short)alVar1[1];
  auVar40._4_2_ = alVar1[1]._2_2_;
  auVar40._6_2_ = *(undefined2 *)((long)input[0xb] + 10);
  auVar40._8_2_ = alVar1[1]._4_2_;
  auVar40._10_2_ = *(undefined2 *)((long)input[0xb] + 0xc);
  auVar40._12_2_ = alVar1[1]._6_2_;
  auVar40._14_2_ = *(undefined2 *)((long)input[0xb] + 0xe);
  auVar9._8_4_ = 0xf1e4078b;
  auVar9._0_8_ = 0xf1e4078bf1e4078b;
  auVar9._12_4_ = 0xf1e4078b;
  auVar99 = pmaddwd(auVar92,auVar9);
  auVar6 = pmaddwd(auVar9,auVar40);
  auVar71._8_4_ = 0x78b0e1c;
  auVar71._0_8_ = 0x78b0e1c078b0e1c;
  auVar71._12_4_ = 0x78b0e1c;
  auVar82 = pmaddwd(auVar92,auVar71);
  auVar61 = pmaddwd(auVar40,auVar71);
  alVar1 = input[0xd];
  auVar131._0_4_ = auVar99._0_4_ + 0x800 >> 0xc;
  auVar131._4_4_ = auVar99._4_4_ + 0x800 >> 0xc;
  auVar131._8_4_ = auVar99._8_4_ + 0x800 >> 0xc;
  auVar131._12_4_ = auVar99._12_4_ + 0x800 >> 0xc;
  auVar10._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar10._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar10._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar10._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar132 = packssdw(auVar131,auVar10);
  auVar110._0_4_ = auVar82._0_4_ + 0x800 >> 0xc;
  auVar110._4_4_ = auVar82._4_4_ + 0x800 >> 0xc;
  auVar110._8_4_ = auVar82._8_4_ + 0x800 >> 0xc;
  auVar110._12_4_ = auVar82._12_4_ + 0x800 >> 0xc;
  auVar41._0_4_ = auVar61._0_4_ + 0x800 >> 0xc;
  auVar41._4_4_ = auVar61._4_4_ + 0x800 >> 0xc;
  auVar41._8_4_ = auVar61._8_4_ + 0x800 >> 0xc;
  auVar41._12_4_ = auVar61._12_4_ + 0x800 >> 0xc;
  auVar82 = packssdw(auVar110,auVar41);
  auVar45._0_12_ = alVar1._0_12_;
  auVar45._12_2_ = alVar1[0]._6_2_;
  auVar45._14_2_ = *(undefined2 *)((long)input[3] + 6);
  auVar44._12_4_ = auVar45._12_4_;
  auVar44._0_10_ = alVar1._0_10_;
  auVar44._10_2_ = *(undefined2 *)((long)input[3] + 4);
  auVar43._10_6_ = auVar44._10_6_;
  auVar43._0_8_ = alVar1[0];
  auVar43._8_2_ = alVar1[0]._4_2_;
  auVar42._8_8_ = auVar43._8_8_;
  auVar42._6_2_ = *(undefined2 *)((long)input[3] + 2);
  auVar42._4_2_ = alVar1[0]._2_2_;
  auVar42._0_2_ = (undefined2)alVar1[0];
  auVar42._2_2_ = (short)input[3][0];
  auVar89._2_2_ = (short)input[3][1];
  auVar89._0_2_ = (short)alVar1[1];
  auVar89._4_2_ = alVar1[1]._2_2_;
  auVar89._6_2_ = *(undefined2 *)((long)input[3] + 10);
  auVar89._8_2_ = alVar1[1]._4_2_;
  auVar89._10_2_ = *(undefined2 *)((long)input[3] + 0xc);
  auVar89._12_2_ = alVar1[1]._6_2_;
  auVar89._14_2_ = *(undefined2 *)((long)input[3] + 0xe);
  auVar11._8_4_ = 0xfb5b0f50;
  auVar11._0_8_ = 0xfb5b0f50fb5b0f50;
  auVar11._12_4_ = 0xfb5b0f50;
  auVar102 = pmaddwd(auVar42,auVar11);
  auVar6 = pmaddwd(auVar11,auVar89);
  auVar72._8_4_ = 0xf5004a5;
  auVar72._0_8_ = 0xf5004a50f5004a5;
  auVar72._12_4_ = 0xf5004a5;
  auVar61 = pmaddwd(auVar42,auVar72);
  auVar99 = pmaddwd(auVar89,auVar72);
  alVar1 = input[2];
  auVar103._0_4_ = auVar102._0_4_ + 0x800 >> 0xc;
  auVar103._4_4_ = auVar102._4_4_ + 0x800 >> 0xc;
  auVar103._8_4_ = auVar102._8_4_ + 0x800 >> 0xc;
  auVar103._12_4_ = auVar102._12_4_ + 0x800 >> 0xc;
  auVar12._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar12._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar12._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar12._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar104 = packssdw(auVar103,auVar12);
  auVar46._0_4_ = auVar61._0_4_ + 0x800 >> 0xc;
  auVar46._4_4_ = auVar61._4_4_ + 0x800 >> 0xc;
  auVar46._8_4_ = auVar61._8_4_ + 0x800 >> 0xc;
  auVar46._12_4_ = auVar61._12_4_ + 0x800 >> 0xc;
  auVar90._0_4_ = auVar99._0_4_ + 0x800 >> 0xc;
  auVar90._4_4_ = auVar99._4_4_ + 0x800 >> 0xc;
  auVar90._8_4_ = auVar99._8_4_ + 0x800 >> 0xc;
  auVar90._12_4_ = auVar99._12_4_ + 0x800 >> 0xc;
  auVar61 = packssdw(auVar46,auVar90);
  auVar116._0_12_ = alVar1._0_12_;
  auVar116._12_2_ = alVar1[0]._6_2_;
  auVar116._14_2_ = *(undefined2 *)((long)input[0xe] + 6);
  auVar115._12_4_ = auVar116._12_4_;
  auVar115._0_10_ = alVar1._0_10_;
  auVar115._10_2_ = *(undefined2 *)((long)input[0xe] + 4);
  auVar114._10_6_ = auVar115._10_6_;
  auVar114._0_8_ = alVar1[0];
  auVar114._8_2_ = alVar1[0]._4_2_;
  auVar113._8_8_ = auVar114._8_8_;
  auVar113._6_2_ = *(undefined2 *)((long)input[0xe] + 2);
  auVar113._4_2_ = alVar1[0]._2_2_;
  auVar113._0_2_ = (undefined2)alVar1[0];
  auVar113._2_2_ = (short)input[0xe][0];
  auVar73._2_2_ = (short)input[0xe][1];
  auVar73._0_2_ = (short)alVar1[1];
  auVar73._4_2_ = alVar1[1]._2_2_;
  auVar73._6_2_ = *(undefined2 *)((long)input[0xe] + 10);
  auVar73._8_2_ = alVar1[1]._4_2_;
  auVar73._10_2_ = *(undefined2 *)((long)input[0xe] + 0xc);
  auVar73._12_2_ = alVar1[1]._6_2_;
  auVar73._14_2_ = *(undefined2 *)((long)input[0xe] + 0xe);
  auVar13._8_4_ = 0xf04f031f;
  auVar13._0_8_ = 0xf04f031ff04f031f;
  auVar13._12_4_ = 0xf04f031f;
  auVar102 = pmaddwd(auVar113,auVar13);
  auVar6 = pmaddwd(auVar13,auVar73);
  auVar33._8_4_ = 0x31f0fb1;
  auVar33._0_8_ = 0x31f0fb1031f0fb1;
  auVar33._12_4_ = 0x31f0fb1;
  auVar117 = pmaddwd(auVar113,auVar33);
  auVar99 = pmaddwd(auVar73,auVar33);
  auVar91._0_4_ = auVar102._0_4_ + 0x800 >> 0xc;
  auVar91._4_4_ = auVar102._4_4_ + 0x800 >> 0xc;
  auVar91._8_4_ = auVar102._8_4_ + 0x800 >> 0xc;
  auVar91._12_4_ = auVar102._12_4_ + 0x800 >> 0xc;
  auVar14._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar14._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar14._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar14._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar92 = packssdw(auVar91,auVar14);
  auVar118._0_4_ = auVar117._0_4_ + 0x800 >> 0xc;
  auVar118._4_4_ = auVar117._4_4_ + 0x800 >> 0xc;
  auVar118._8_4_ = auVar117._8_4_ + 0x800 >> 0xc;
  auVar118._12_4_ = auVar117._12_4_ + 0x800 >> 0xc;
  auVar74._0_4_ = auVar99._0_4_ + 0x800 >> 0xc;
  auVar74._4_4_ = auVar99._4_4_ + 0x800 >> 0xc;
  auVar74._8_4_ = auVar99._8_4_ + 0x800 >> 0xc;
  auVar74._12_4_ = auVar99._12_4_ + 0x800 >> 0xc;
  auVar119 = packssdw(auVar118,auVar74);
  auVar78._0_12_ = alVar4._0_12_;
  auVar78._12_2_ = alVar4[0]._6_2_;
  auVar78._14_2_ = *(undefined2 *)((long)input[6] + 6);
  auVar77._12_4_ = auVar78._12_4_;
  auVar77._0_10_ = alVar4._0_10_;
  auVar77._10_2_ = *(undefined2 *)((long)input[6] + 4);
  auVar76._10_6_ = auVar77._10_6_;
  auVar76._0_8_ = alVar4[0];
  auVar76._8_2_ = alVar4[0]._4_2_;
  auVar75._8_8_ = auVar76._8_8_;
  auVar75._6_2_ = *(undefined2 *)((long)input[6] + 2);
  auVar75._4_2_ = alVar4[0]._2_2_;
  auVar75._0_2_ = (undefined2)alVar4[0];
  auVar75._2_2_ = (short)input[6][0];
  auVar108._2_2_ = (short)input[6][1];
  auVar108._0_2_ = (short)alVar4[1];
  auVar108._4_2_ = alVar4[1]._2_2_;
  auVar108._6_2_ = *(undefined2 *)((long)input[6] + 10);
  auVar108._8_2_ = alVar4[1]._4_2_;
  auVar108._10_2_ = *(undefined2 *)((long)input[6] + 0xc);
  auVar108._12_2_ = alVar4[1]._6_2_;
  auVar108._14_2_ = *(undefined2 *)((long)input[6] + 0xe);
  auVar15._8_4_ = 0xf71c0d4e;
  auVar15._0_8_ = 0xf71c0d4ef71c0d4e;
  auVar15._12_4_ = 0xf71c0d4e;
  auVar117 = pmaddwd(auVar75,auVar15);
  auVar6 = pmaddwd(auVar15,auVar108);
  auVar34._8_4_ = 0xd4e08e4;
  auVar34._0_8_ = 0xd4e08e40d4e08e4;
  auVar34._12_4_ = 0xd4e08e4;
  auVar99 = pmaddwd(auVar75,auVar34);
  auVar102 = pmaddwd(auVar108,auVar34);
  auVar135._0_4_ = auVar117._0_4_ + 0x800 >> 0xc;
  auVar135._4_4_ = auVar117._4_4_ + 0x800 >> 0xc;
  auVar135._8_4_ = auVar117._8_4_ + 0x800 >> 0xc;
  auVar135._12_4_ = auVar117._12_4_ + 0x800 >> 0xc;
  auVar16._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar16._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar16._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar16._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar136 = packssdw(auVar135,auVar16);
  alVar4 = *input;
  auVar79._0_4_ = auVar99._0_4_ + 0x800 >> 0xc;
  auVar79._4_4_ = auVar99._4_4_ + 0x800 >> 0xc;
  auVar79._8_4_ = auVar99._8_4_ + 0x800 >> 0xc;
  auVar79._12_4_ = auVar99._12_4_ + 0x800 >> 0xc;
  auVar109._0_4_ = auVar102._0_4_ + 0x800 >> 0xc;
  auVar109._4_4_ = auVar102._4_4_ + 0x800 >> 0xc;
  auVar109._8_4_ = auVar102._8_4_ + 0x800 >> 0xc;
  auVar109._12_4_ = auVar102._12_4_ + 0x800 >> 0xc;
  auVar80 = packssdw(auVar79,auVar109);
  auVar17 = paddsw(auVar84,auVar3);
  auVar85 = psubsw(auVar84,auVar3);
  auVar110 = psubsw(auVar104,auVar132);
  auVar105 = paddsw(auVar104,auVar132);
  auVar3 = paddsw(auVar61,auVar82);
  auVar132 = psubsw(auVar61,auVar82);
  auVar133 = psubsw(auVar63,auVar101);
  auVar82 = paddsw(auVar101,auVar63);
  auVar21._0_12_ = alVar4._0_12_;
  auVar21._12_2_ = alVar4[0]._6_2_;
  auVar21._14_2_ = *(undefined2 *)((long)input[8] + 6);
  auVar20._12_4_ = auVar21._12_4_;
  auVar20._0_10_ = alVar4._0_10_;
  auVar20._10_2_ = *(undefined2 *)((long)input[8] + 4);
  auVar19._10_6_ = auVar20._10_6_;
  auVar19._0_8_ = alVar4[0];
  auVar19._8_2_ = alVar4[0]._4_2_;
  auVar18._8_8_ = auVar19._8_8_;
  auVar18._6_2_ = *(undefined2 *)((long)input[8] + 2);
  auVar18._4_2_ = alVar4[0]._2_2_;
  auVar18._0_2_ = (undefined2)alVar4[0];
  auVar18._2_2_ = (short)input[8][0];
  auVar35._2_2_ = (short)input[8][1];
  auVar35._0_2_ = (short)alVar4[1];
  auVar35._4_2_ = alVar4[1]._2_2_;
  auVar35._6_2_ = *(undefined2 *)((long)input[8] + 10);
  auVar35._8_2_ = alVar4[1]._4_2_;
  auVar35._10_2_ = *(undefined2 *)((long)input[8] + 0xc);
  auVar35._12_2_ = alVar4[1]._6_2_;
  auVar35._14_2_ = *(undefined2 *)((long)input[8] + 0xe);
  auVar61._8_4_ = 0xf4b00b50;
  auVar61._0_8_ = 0xf4b00b50f4b00b50;
  auVar61._12_4_ = 0xf4b00b50;
  auVar99 = pmaddwd(auVar18,auVar61);
  auVar61 = pmaddwd(auVar35,auVar61);
  auVar63._8_4_ = 0xb500b50;
  auVar63._0_8_ = 0xb500b500b500b50;
  auVar63._12_4_ = 0xb500b50;
  auVar84 = pmaddwd(auVar18,auVar63);
  auVar6 = pmaddwd(auVar35,auVar63);
  auVar106._0_4_ = auVar84._0_4_ + 0x800 >> 0xc;
  auVar106._4_4_ = auVar84._4_4_ + 0x800 >> 0xc;
  auVar106._8_4_ = auVar84._8_4_ + 0x800 >> 0xc;
  auVar106._12_4_ = auVar84._12_4_ + 0x800 >> 0xc;
  auVar125._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar125._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar125._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar125._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar107 = packssdw(auVar106,auVar125);
  auVar22._0_4_ = auVar99._0_4_ + 0x800 >> 0xc;
  auVar22._4_4_ = auVar99._4_4_ + 0x800 >> 0xc;
  auVar22._8_4_ = auVar99._8_4_ + 0x800 >> 0xc;
  auVar22._12_4_ = auVar99._12_4_ + 0x800 >> 0xc;
  auVar36._0_4_ = auVar61._0_4_ + 0x800 >> 0xc;
  auVar36._4_4_ = auVar61._4_4_ + 0x800 >> 0xc;
  auVar36._8_4_ = auVar61._8_4_ + 0x800 >> 0xc;
  auVar36._12_4_ = auVar61._12_4_ + 0x800 >> 0xc;
  auVar117 = packssdw(auVar22,auVar36);
  alVar4 = input[4];
  auVar101._0_12_ = alVar4._0_12_;
  auVar101._12_2_ = alVar4[0]._6_2_;
  auVar101._14_2_ = *(undefined2 *)((long)input[0xc] + 6);
  auVar102._12_4_ = auVar101._12_4_;
  auVar102._0_10_ = alVar4._0_10_;
  auVar102._10_2_ = *(undefined2 *)((long)input[0xc] + 4);
  auVar84._10_6_ = auVar102._10_6_;
  auVar84._0_8_ = alVar4[0];
  auVar84._8_2_ = alVar4[0]._4_2_;
  auVar99._8_8_ = auVar84._8_8_;
  auVar99._6_2_ = *(undefined2 *)((long)input[0xc] + 2);
  auVar99._4_2_ = alVar4[0]._2_2_;
  auVar99._0_2_ = (undefined2)alVar4[0];
  auVar99._2_2_ = (short)input[0xc][0];
  auVar37._2_2_ = (short)input[0xc][1];
  auVar37._0_2_ = (short)alVar4[1];
  auVar37._4_2_ = alVar4[1]._2_2_;
  auVar37._6_2_ = *(undefined2 *)((long)input[0xc] + 10);
  auVar37._8_2_ = alVar4[1]._4_2_;
  auVar37._10_2_ = *(undefined2 *)((long)input[0xc] + 0xc);
  auVar37._12_2_ = alVar4[1]._6_2_;
  auVar37._14_2_ = *(undefined2 *)((long)input[0xc] + 0xe);
  auVar27._8_4_ = 0xf138061f;
  auVar27._0_8_ = 0xf138061ff138061f;
  auVar27._12_4_ = 0xf138061f;
  auVar61 = pmaddwd(auVar99,auVar27);
  auVar84 = pmaddwd(auVar27,auVar37);
  auVar64._8_4_ = 0x61f0ec8;
  auVar64._0_8_ = 0x61f0ec8061f0ec8;
  auVar64._12_4_ = 0x61f0ec8;
  auVar6 = pmaddwd(auVar99,auVar64);
  auVar99 = pmaddwd(auVar37,auVar64);
  auVar138._0_4_ = auVar61._0_4_ + 0x800 >> 0xc;
  auVar138._4_4_ = auVar61._4_4_ + 0x800 >> 0xc;
  auVar138._8_4_ = auVar61._8_4_ + 0x800 >> 0xc;
  auVar138._12_4_ = auVar61._12_4_ + 0x800 >> 0xc;
  auVar28._0_4_ = auVar84._0_4_ + 0x800 >> 0xc;
  auVar28._4_4_ = auVar84._4_4_ + 0x800 >> 0xc;
  auVar28._8_4_ = auVar84._8_4_ + 0x800 >> 0xc;
  auVar28._12_4_ = auVar84._12_4_ + 0x800 >> 0xc;
  auVar61 = packssdw(auVar138,auVar28);
  auVar104._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar104._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar104._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar104._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar38._0_4_ = auVar99._0_4_ + 0x800 >> 0xc;
  auVar38._4_4_ = auVar99._4_4_ + 0x800 >> 0xc;
  auVar38._8_4_ = auVar99._8_4_ + 0x800 >> 0xc;
  auVar38._12_4_ = auVar99._12_4_ + 0x800 >> 0xc;
  auVar6 = packssdw(auVar104,auVar38);
  auVar101 = paddsw(auVar92,auVar136);
  auVar136 = psubsw(auVar92,auVar136);
  auVar104 = psubsw(auVar119,auVar80);
  auVar92 = paddsw(auVar80,auVar119);
  auVar123._0_12_ = auVar85._0_12_;
  auVar123._12_2_ = auVar85._6_2_;
  auVar123._14_2_ = auVar133._6_2_;
  auVar122._12_4_ = auVar123._12_4_;
  auVar122._0_10_ = auVar85._0_10_;
  auVar122._10_2_ = auVar133._4_2_;
  auVar121._10_6_ = auVar122._10_6_;
  auVar121._0_8_ = auVar85._0_8_;
  auVar121._8_2_ = auVar85._4_2_;
  auVar120._8_8_ = auVar121._8_8_;
  auVar120._6_2_ = auVar133._2_2_;
  auVar120._4_2_ = auVar85._2_2_;
  auVar120._0_2_ = auVar85._0_2_;
  auVar120._2_2_ = auVar133._0_2_;
  auVar86._2_2_ = auVar133._8_2_;
  auVar86._0_2_ = auVar85._8_2_;
  auVar86._4_2_ = auVar85._10_2_;
  auVar86._6_2_ = auVar133._10_2_;
  auVar86._8_2_ = auVar85._12_2_;
  auVar86._10_2_ = auVar133._12_2_;
  auVar86._12_2_ = auVar85._14_2_;
  auVar86._14_2_ = auVar133._14_2_;
  auVar29._8_4_ = 0xec8061f;
  auVar29._0_8_ = 0xec8061f0ec8061f;
  auVar29._12_4_ = 0xec8061f;
  auVar102 = pmaddwd(auVar120,auVar29);
  auVar84 = pmaddwd(auVar86,auVar29);
  auVar39._8_4_ = 0x61ff138;
  auVar39._0_8_ = 0x61ff138061ff138;
  auVar39._12_4_ = 0x61ff138;
  auVar80 = pmaddwd(auVar120,auVar39);
  auVar99 = pmaddwd(auVar86,auVar39);
  auVar137._0_4_ = auVar80._0_4_ + 0x800 >> 0xc;
  auVar137._4_4_ = auVar80._4_4_ + 0x800 >> 0xc;
  auVar137._8_4_ = auVar80._8_4_ + 0x800 >> 0xc;
  auVar137._12_4_ = auVar80._12_4_ + 0x800 >> 0xc;
  auVar65._0_4_ = auVar99._0_4_ + 0x800 >> 0xc;
  auVar65._4_4_ = auVar99._4_4_ + 0x800 >> 0xc;
  auVar65._8_4_ = auVar99._8_4_ + 0x800 >> 0xc;
  auVar65._12_4_ = auVar99._12_4_ + 0x800 >> 0xc;
  auVar138 = packssdw(auVar137,auVar65);
  auVar124._0_4_ = auVar102._0_4_ + 0x800 >> 0xc;
  auVar124._4_4_ = auVar102._4_4_ + 0x800 >> 0xc;
  auVar124._8_4_ = auVar102._8_4_ + 0x800 >> 0xc;
  auVar124._12_4_ = auVar102._12_4_ + 0x800 >> 0xc;
  auVar87._0_4_ = auVar84._0_4_ + 0x800 >> 0xc;
  auVar87._4_4_ = auVar84._4_4_ + 0x800 >> 0xc;
  auVar87._8_4_ = auVar84._8_4_ + 0x800 >> 0xc;
  auVar87._12_4_ = auVar84._12_4_ + 0x800 >> 0xc;
  auVar125 = packssdw(auVar124,auVar87);
  auVar69._0_12_ = auVar110._0_12_;
  auVar69._12_2_ = auVar110._6_2_;
  auVar69._14_2_ = auVar132._6_2_;
  auVar68._12_4_ = auVar69._12_4_;
  auVar68._0_10_ = auVar110._0_10_;
  auVar68._10_2_ = auVar132._4_2_;
  auVar67._10_6_ = auVar68._10_6_;
  auVar67._0_8_ = auVar110._0_8_;
  auVar67._8_2_ = auVar110._4_2_;
  auVar66._8_8_ = auVar67._8_8_;
  auVar66._6_2_ = auVar132._2_2_;
  auVar66._4_2_ = auVar110._2_2_;
  auVar66._0_2_ = auVar110._0_2_;
  auVar66._2_2_ = auVar132._0_2_;
  auVar111._2_2_ = auVar132._8_2_;
  auVar111._0_2_ = auVar110._8_2_;
  auVar111._4_2_ = auVar110._10_2_;
  auVar111._6_2_ = auVar132._10_2_;
  auVar111._8_2_ = auVar110._12_2_;
  auVar111._10_2_ = auVar132._12_2_;
  auVar111._12_2_ = auVar110._14_2_;
  auVar111._14_2_ = auVar132._14_2_;
  auVar25._8_4_ = 0xf138f9e1;
  auVar25._0_8_ = 0xf138f9e1f138f9e1;
  auVar25._12_4_ = 0xf138f9e1;
  auVar132 = pmaddwd(auVar66,auVar25);
  auVar99 = pmaddwd(auVar25,auVar111);
  auVar84 = pmaddwd(auVar66,auVar39);
  auVar102 = pmaddwd(auVar111,auVar39);
  auVar134._0_4_ = auVar132._0_4_ + 0x800 >> 0xc;
  auVar134._4_4_ = auVar132._4_4_ + 0x800 >> 0xc;
  auVar134._8_4_ = auVar132._8_4_ + 0x800 >> 0xc;
  auVar134._12_4_ = auVar132._12_4_ + 0x800 >> 0xc;
  auVar26._0_4_ = auVar99._0_4_ + 0x800 >> 0xc;
  auVar26._4_4_ = auVar99._4_4_ + 0x800 >> 0xc;
  auVar26._8_4_ = auVar99._8_4_ + 0x800 >> 0xc;
  auVar26._12_4_ = auVar99._12_4_ + 0x800 >> 0xc;
  auVar99 = packssdw(auVar134,auVar26);
  auVar70._0_4_ = auVar84._0_4_ + 0x800 >> 0xc;
  auVar70._4_4_ = auVar84._4_4_ + 0x800 >> 0xc;
  auVar70._8_4_ = auVar84._8_4_ + 0x800 >> 0xc;
  auVar70._12_4_ = auVar84._12_4_ + 0x800 >> 0xc;
  auVar112._0_4_ = auVar102._0_4_ + 0x800 >> 0xc;
  auVar112._4_4_ = auVar102._4_4_ + 0x800 >> 0xc;
  auVar112._8_4_ = auVar102._8_4_ + 0x800 >> 0xc;
  auVar112._12_4_ = auVar102._12_4_ + 0x800 >> 0xc;
  auVar85 = packssdw(auVar70,auVar112);
  auVar102 = paddsw(auVar107,auVar6);
  auVar110 = psubsw(auVar107,auVar6);
  auVar132 = paddsw(auVar117,auVar61);
  auVar84 = psubsw(auVar117,auVar61);
  local_88 = auVar104._0_2_;
  uStack_86 = auVar104._2_2_;
  uStack_84 = auVar104._4_2_;
  uStack_82 = auVar104._6_2_;
  uStack_80 = auVar104._8_2_;
  uStack_7e = auVar104._10_2_;
  uStack_7c = auVar104._12_2_;
  uStack_7a = auVar104._14_2_;
  auVar50._0_12_ = auVar136._0_12_;
  auVar50._12_2_ = auVar136._6_2_;
  auVar50._14_2_ = uStack_82;
  auVar49._12_4_ = auVar50._12_4_;
  auVar49._0_10_ = auVar136._0_10_;
  auVar49._10_2_ = uStack_84;
  auVar48._10_6_ = auVar49._10_6_;
  auVar48._0_8_ = auVar136._0_8_;
  auVar48._8_2_ = auVar136._4_2_;
  auVar47._8_8_ = auVar48._8_8_;
  auVar47._6_2_ = uStack_86;
  auVar47._4_2_ = auVar136._2_2_;
  auVar47._0_2_ = auVar136._0_2_;
  auVar47._2_2_ = local_88;
  auVar93._2_2_ = uStack_80;
  auVar93._0_2_ = auVar136._8_2_;
  auVar93._4_2_ = auVar136._10_2_;
  auVar93._6_2_ = uStack_7e;
  auVar93._8_2_ = auVar136._12_2_;
  auVar93._10_2_ = uStack_7c;
  auVar93._12_2_ = auVar136._14_2_;
  auVar93._14_2_ = uStack_7a;
  auVar117._8_4_ = 0xb50f4b0;
  auVar117._0_8_ = 0xb50f4b00b50f4b0;
  auVar117._12_4_ = 0xb50f4b0;
  auVar61 = pmaddwd(auVar47,auVar117);
  auVar6 = pmaddwd(auVar93,auVar117);
  auVar88._0_4_ = auVar61._0_4_ + 0x800 >> 0xc;
  auVar88._4_4_ = auVar61._4_4_ + 0x800 >> 0xc;
  auVar88._8_4_ = auVar61._8_4_ + 0x800 >> 0xc;
  auVar88._12_4_ = auVar61._12_4_ + 0x800 >> 0xc;
  auVar119._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar119._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar119._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar119._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar136 = packssdw(auVar88,auVar119);
  auVar6 = pmaddwd(auVar47,auVar63);
  auVar61 = pmaddwd(auVar93,auVar63);
  auVar51._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar51._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar51._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar51._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar94._0_4_ = auVar61._0_4_ + 0x800 >> 0xc;
  auVar94._4_4_ = auVar61._4_4_ + 0x800 >> 0xc;
  auVar94._8_4_ = auVar61._8_4_ + 0x800 >> 0xc;
  auVar94._12_4_ = auVar61._12_4_ + 0x800 >> 0xc;
  auVar80 = packssdw(auVar51,auVar94);
  auVar107 = paddsw(auVar17,auVar105);
  auVar6 = psubsw(auVar17,auVar105);
  auVar61 = paddsw(auVar138,auVar99);
  auVar17 = psubsw(auVar138,auVar99);
  auVar99 = psubsw(auVar82,auVar3);
  auVar104 = paddsw(auVar82,auVar3);
  auVar3 = psubsw(auVar125,auVar85);
  auVar85 = paddsw(auVar85,auVar125);
  auVar105 = paddsw(auVar102,auVar92);
  auVar102 = psubsw(auVar102,auVar92);
  auVar125 = paddsw(auVar132,auVar80);
  auVar132 = psubsw(auVar132,auVar80);
  auVar138 = paddsw(auVar84,auVar136);
  auVar84 = psubsw(auVar84,auVar136);
  auVar80 = paddsw(auVar110,auVar101);
  auVar92 = psubsw(auVar110,auVar101);
  auVar129._0_12_ = auVar17._0_12_;
  auVar129._12_2_ = auVar17._6_2_;
  auVar129._14_2_ = auVar3._6_2_;
  auVar128._12_4_ = auVar129._12_4_;
  auVar128._0_10_ = auVar17._0_10_;
  auVar128._10_2_ = auVar3._4_2_;
  auVar127._10_6_ = auVar128._10_6_;
  auVar127._0_8_ = auVar17._0_8_;
  auVar127._8_2_ = auVar17._4_2_;
  auVar126._8_8_ = auVar127._8_8_;
  auVar126._6_2_ = auVar3._2_2_;
  auVar126._4_2_ = auVar17._2_2_;
  auVar126._0_2_ = auVar17._0_2_;
  auVar126._2_2_ = auVar3._0_2_;
  auVar139._2_2_ = auVar3._8_2_;
  auVar139._0_2_ = auVar17._8_2_;
  auVar139._4_2_ = auVar17._10_2_;
  auVar139._6_2_ = auVar3._10_2_;
  auVar139._8_2_ = auVar17._12_2_;
  auVar139._10_2_ = auVar3._12_2_;
  auVar139._12_2_ = auVar17._14_2_;
  auVar139._14_2_ = auVar3._14_2_;
  auVar82 = pmaddwd(auVar126,auVar117);
  auVar3 = pmaddwd(auVar139,auVar117);
  auVar81._0_4_ = auVar82._0_4_ + 0x800 >> 0xc;
  auVar81._4_4_ = auVar82._4_4_ + 0x800 >> 0xc;
  auVar81._8_4_ = auVar82._8_4_ + 0x800 >> 0xc;
  auVar81._12_4_ = auVar82._12_4_ + 0x800 >> 0xc;
  auVar30._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar30._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar30._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar30._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar101 = packssdw(auVar81,auVar30);
  auVar3 = pmaddwd(auVar126,auVar63);
  auVar82 = pmaddwd(auVar139,auVar63);
  auVar130._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar130._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar130._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar130._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar140._0_4_ = auVar82._0_4_ + 0x800 >> 0xc;
  auVar140._4_4_ = auVar82._4_4_ + 0x800 >> 0xc;
  auVar140._8_4_ = auVar82._8_4_ + 0x800 >> 0xc;
  auVar140._12_4_ = auVar82._12_4_ + 0x800 >> 0xc;
  auVar136 = packssdw(auVar130,auVar140);
  auVar55._0_12_ = auVar6._0_12_;
  auVar55._12_2_ = auVar6._6_2_;
  auVar55._14_2_ = auVar99._6_2_;
  auVar54._12_4_ = auVar55._12_4_;
  auVar54._0_10_ = auVar6._0_10_;
  auVar54._10_2_ = auVar99._4_2_;
  auVar53._10_6_ = auVar54._10_6_;
  auVar53._0_8_ = auVar6._0_8_;
  auVar53._8_2_ = auVar6._4_2_;
  auVar52._8_8_ = auVar53._8_8_;
  auVar52._6_2_ = auVar99._2_2_;
  auVar52._4_2_ = auVar6._2_2_;
  auVar52._0_2_ = auVar6._0_2_;
  auVar52._2_2_ = auVar99._0_2_;
  auVar31._2_2_ = auVar99._8_2_;
  auVar31._0_2_ = auVar6._8_2_;
  auVar31._4_2_ = auVar6._10_2_;
  auVar31._6_2_ = auVar99._10_2_;
  auVar31._8_2_ = auVar6._12_2_;
  auVar31._10_2_ = auVar99._12_2_;
  auVar31._12_2_ = auVar6._14_2_;
  auVar31._14_2_ = auVar99._14_2_;
  auVar82 = pmaddwd(auVar52,auVar117);
  auVar3 = pmaddwd(auVar117,auVar31);
  auVar99 = pmaddwd(auVar52,auVar63);
  auVar6 = pmaddwd(auVar31,auVar63);
  auVar133._0_4_ = auVar82._0_4_ + 0x800 >> 0xc;
  auVar133._4_4_ = auVar82._4_4_ + 0x800 >> 0xc;
  auVar133._8_4_ = auVar82._8_4_ + 0x800 >> 0xc;
  auVar133._12_4_ = auVar82._12_4_ + 0x800 >> 0xc;
  auVar17._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar17._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar17._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar17._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar3 = packssdw(auVar133,auVar17);
  auVar56._0_4_ = auVar99._0_4_ + 0x800 >> 0xc;
  auVar56._4_4_ = auVar99._4_4_ + 0x800 >> 0xc;
  auVar56._8_4_ = auVar99._8_4_ + 0x800 >> 0xc;
  auVar56._12_4_ = auVar99._12_4_ + 0x800 >> 0xc;
  auVar32._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar32._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar32._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar32._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar82 = packssdw(auVar56,auVar32);
  alVar4 = (__m128i)paddsw(auVar105,auVar104);
  *output = alVar4;
  alVar4 = (__m128i)psubsw(auVar105,auVar104);
  output[0xf] = alVar4;
  alVar4 = (__m128i)paddsw(auVar125,auVar85);
  output[1] = alVar4;
  alVar4 = (__m128i)psubsw(auVar125,auVar85);
  output[0xe] = alVar4;
  alVar4 = (__m128i)paddsw(auVar138,auVar136);
  output[2] = alVar4;
  alVar4 = (__m128i)psubsw(auVar138,auVar136);
  output[0xd] = alVar4;
  alVar4 = (__m128i)paddsw(auVar80,auVar82);
  output[3] = alVar4;
  alVar4 = (__m128i)psubsw(auVar80,auVar82);
  output[0xc] = alVar4;
  alVar4 = (__m128i)paddsw(auVar92,auVar3);
  output[4] = alVar4;
  alVar4 = (__m128i)psubsw(auVar92,auVar3);
  output[0xb] = alVar4;
  alVar4 = (__m128i)paddsw(auVar84,auVar101);
  output[5] = alVar4;
  alVar4 = (__m128i)psubsw(auVar84,auVar101);
  output[10] = alVar4;
  alVar4 = (__m128i)paddsw(auVar132,auVar61);
  output[6] = alVar4;
  alVar4 = (__m128i)psubsw(auVar132,auVar61);
  output[9] = alVar4;
  alVar4 = (__m128i)paddsw(auVar102,auVar107);
  output[7] = alVar4;
  alVar4 = (__m128i)psubsw(auVar102,auVar107);
  output[8] = alVar4;
  return;
}

Assistant:

static void idct16_sse2(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m128i cospi_p60_m04 = pair_set_epi16(cospi[60], -cospi[4]);
  const __m128i cospi_p04_p60 = pair_set_epi16(cospi[4], cospi[60]);
  const __m128i cospi_p28_m36 = pair_set_epi16(cospi[28], -cospi[36]);
  const __m128i cospi_p36_p28 = pair_set_epi16(cospi[36], cospi[28]);
  const __m128i cospi_p44_m20 = pair_set_epi16(cospi[44], -cospi[20]);
  const __m128i cospi_p20_p44 = pair_set_epi16(cospi[20], cospi[44]);
  const __m128i cospi_p12_m52 = pair_set_epi16(cospi[12], -cospi[52]);
  const __m128i cospi_p52_p12 = pair_set_epi16(cospi[52], cospi[12]);
  const __m128i cospi_p56_m08 = pair_set_epi16(cospi[56], -cospi[8]);
  const __m128i cospi_p08_p56 = pair_set_epi16(cospi[8], cospi[56]);
  const __m128i cospi_p24_m40 = pair_set_epi16(cospi[24], -cospi[40]);
  const __m128i cospi_p40_p24 = pair_set_epi16(cospi[40], cospi[24]);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);
  const __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);
  const __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);
  const __m128i cospi_m16_p48 = pair_set_epi16(-cospi[16], cospi[48]);
  const __m128i cospi_p48_p16 = pair_set_epi16(cospi[48], cospi[16]);
  const __m128i cospi_m48_m16 = pair_set_epi16(-cospi[48], -cospi[16]);

  // stage 1
  __m128i x[16];
  x[0] = input[0];
  x[1] = input[8];
  x[2] = input[4];
  x[3] = input[12];
  x[4] = input[2];
  x[5] = input[10];
  x[6] = input[6];
  x[7] = input[14];
  x[8] = input[1];
  x[9] = input[9];
  x[10] = input[5];
  x[11] = input[13];
  x[12] = input[3];
  x[13] = input[11];
  x[14] = input[7];
  x[15] = input[15];

  // stage 2
  btf_16_sse2(cospi_p60_m04, cospi_p04_p60, x[8], x[15], x[8], x[15]);
  btf_16_sse2(cospi_p28_m36, cospi_p36_p28, x[9], x[14], x[9], x[14]);
  btf_16_sse2(cospi_p44_m20, cospi_p20_p44, x[10], x[13], x[10], x[13]);
  btf_16_sse2(cospi_p12_m52, cospi_p52_p12, x[11], x[12], x[11], x[12]);

  // stage 3
  btf_16_sse2(cospi_p56_m08, cospi_p08_p56, x[4], x[7], x[4], x[7]);
  btf_16_sse2(cospi_p24_m40, cospi_p40_p24, x[5], x[6], x[5], x[6]);
  btf_16_adds_subs_sse2(x[8], x[9]);
  btf_16_subs_adds_sse2(x[11], x[10]);
  btf_16_adds_subs_sse2(x[12], x[13]);
  btf_16_subs_adds_sse2(x[15], x[14]);

  // stage 4
  btf_16_sse2(cospi_p32_p32, cospi_p32_m32, x[0], x[1], x[0], x[1]);
  btf_16_sse2(cospi_p48_m16, cospi_p16_p48, x[2], x[3], x[2], x[3]);
  btf_16_adds_subs_sse2(x[4], x[5]);
  btf_16_subs_adds_sse2(x[7], x[6]);
  btf_16_sse2(cospi_m16_p48, cospi_p48_p16, x[9], x[14], x[9], x[14]);
  btf_16_sse2(cospi_m48_m16, cospi_m16_p48, x[10], x[13], x[10], x[13]);

  // stage 5~7
  idct16_stage5_sse2(x, cospi, __rounding, cos_bit);
  idct16_stage6_sse2(x, cospi, __rounding, cos_bit);
  idct16_stage7_sse2(output, x);
}